

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_SetArrayItemC_CI4<Js::OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  ushort uVar1;
  Var pvVar2;
  Type *pTVar3;
  code *pcVar4;
  bool bVar5;
  JavascriptArray *this_00;
  JavascriptCopyOnAccessNativeIntArray *this_01;
  undefined4 *puVar6;
  
  pvVar2 = *(Var *)(this + (ulong)playout->Instance * 8 + 0x160);
  ValidateRegValue(this,pvVar2,false,true);
  this_00 = JavascriptArray::FromAnyArray(pvVar2);
  uVar1 = playout->Element;
  pvVar2 = *(Var *)(this + (ulong)playout->Value * 8 + 0x160);
  ValidateRegValue(this,pvVar2,false,true);
  if (pvVar2 != (Var)0x0) {
    bVar5 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar2);
    if (bVar5) {
      this_01 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar2);
    }
    else {
      this_01 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (this_01 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_01);
    }
  }
  if ((((((this_00->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr !=
      *(ScriptContext **)(this + 0x78)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x15bf,"(array->GetScriptContext() == GetScriptContext())",
                                "array->GetScriptContext() == GetScriptContext()");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  pTVar3 = (this_00->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr;
  if (pTVar3->typeId != TypeIds_ArrayLast) {
    if (pTVar3->typeId == TypeIds_NativeIntArray) {
      JavascriptArray::OP_SetNativeIntElementC
                ((JavascriptNativeIntArray *)this_00,(uint)uVar1,pvVar2,
                 (((pTVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
      ;
      return;
    }
    JavascriptArray::SetArrayLiteralItem<void*>(this_00,(uint)uVar1,pvVar2);
    return;
  }
  JavascriptArray::OP_SetNativeFloatElementC
            ((JavascriptNativeFloatArray *)this_00,(uint)uVar1,pvVar2,
             (((pTVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetArrayItemC_CI4(const unaligned T* playout)
    {
        JavascriptArray* array = JavascriptArray::FromAnyArray(GetReg(playout->Instance));
        uint32 index = playout->Element;
        Var value = GetReg(playout->Value);

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(value);
#endif

        // The array is create by the built-in on the same script context
        Assert(array->GetScriptContext() == GetScriptContext());
        TypeId typeId = array->GetTypeId();
        if (typeId == TypeIds_NativeIntArray)
        {
            JavascriptArray::OP_SetNativeIntElementC(reinterpret_cast<JavascriptNativeIntArray*>(array), index, value, array->GetScriptContext());
        }
        else if (typeId == TypeIds_NativeFloatArray)
        {
            JavascriptArray::OP_SetNativeFloatElementC(reinterpret_cast<JavascriptNativeFloatArray*>(array), index, value, array->GetScriptContext());
        }
        else
        {
            array->SetArrayLiteralItem(index, value);
        }
    }